

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O2

double __thiscall DiStefano::Alloc(DiStefano *this)

{
  PerformanceEvaluator *this_00;
  ulong uVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  Mat1i *pMVar5;
  Mat1b *pMVar6;
  int *piVar7;
  bool *pbVar8;
  long lVar9;
  ulong uVar10;
  Size local_90;
  Mat local_88 [96];
  
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(this_00);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_90.height = (int)uVar2;
  local_90.width = (int)((ulong)uVar2 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_88,&local_90);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_88);
  cv::Mat::~Mat(local_88);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  lVar9 = (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2);
  uVar1 = lVar9 + 1;
  uVar10 = -(ulong)(uVar1 >> 0x3e != 0) | lVar9 * 4 + 4U;
  piVar7 = (int *)operator_new__(uVar10);
  this->a_class = piVar7;
  pbVar8 = (bool *)operator_new__(uVar1);
  this->a_single = pbVar8;
  piVar7 = (int *)operator_new__(uVar10);
  this->a_renum = piVar7;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  memset(this->a_class,0,
         (long)((*(int *)&pMVar6->field_0xc + 1) / 2) * (long)((*(int *)&pMVar6->field_0x8 + 1) / 2)
         * 4 + 4);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(this->a_single,0,
         (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2) + 1);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  memset(this->a_renum,0,
         (long)((*(int *)&pMVar6->field_0xc + 1) / 2) * (long)((*(int *)&pMVar6->field_0x8 + 1) / 2)
         * 4 + 4);
  PerformanceEvaluator::stop(this_00);
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  PerformanceEvaluator::start(this_00);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  memset(this->a_class,0,
         (long)((*(int *)&pMVar6->field_0xc + 1) / 2) * (long)((*(int *)&pMVar6->field_0x8 + 1) / 2)
         * 4 + 4);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(this->a_single,0,
         (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2) + 1);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  memset(this->a_renum,0,
         (long)((*(int *)&pMVar6->field_0xc + 1) / 2) * (long)((*(int *)&pMVar6->field_0x8 + 1) / 2)
         * 4 + 4);
  PerformanceEvaluator::stop(this_00);
  return (dVar3 * 1000.0) / dVar4 -
         ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last *
         1000.0) / (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                   tick_frequency_;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }